

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webp_quality.c
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  ulong uVar6;
  bool bVar7;
  uint8_t *data;
  size_t data_size;
  uint8_t *local_48;
  size_t local_40;
  ulong local_38;
  
  if (argc < 2) {
    return 0;
  }
  local_38 = (ulong)(uint)argc;
  iVar3 = 1;
  bVar1 = false;
  uVar6 = 2;
  do {
    pcVar5 = argv[uVar6 - 1];
    iVar2 = strcmp(pcVar5,"-quiet");
    bVar7 = true;
    if (iVar2 != 0) {
      iVar3 = strcmp(pcVar5,"-help");
      if ((iVar3 == 0) || (iVar3 = strcmp(pcVar5,"-h"), iVar3 == 0)) {
        puts("webp_quality [-h][-quiet] webp_files...");
        return 0;
      }
      iVar3 = 0;
      local_48 = (uint8_t *)0x0;
      local_40 = 0;
      iVar2 = ImgIoUtilReadFile(pcVar5,&local_48,&local_40);
      if (iVar2 != 0) {
        uVar4 = VP8EstimateQuality(local_48,local_40);
        if (!bVar1) {
          printf("[%s] ",pcVar5);
        }
        if ((int)uVar4 < 0) {
          main_cold_1();
          iVar3 = 0;
        }
        else {
          if (bVar1) {
            pcVar5 = "%d\n";
          }
          else {
            pcVar5 = "Estimated quality factor: %d\n";
          }
          printf(pcVar5,(ulong)uVar4);
          iVar3 = iVar2;
        }
        free(local_48);
      }
      bVar7 = bVar1;
      if (iVar2 == 0) {
LAB_001034c5:
        return (uint)(iVar3 == 0);
      }
    }
    bVar1 = bVar7;
    if ((iVar3 == 0) || (bVar7 = local_38 <= uVar6, uVar6 = uVar6 + 1, bVar7)) goto LAB_001034c5;
  } while( true );
}

Assistant:

int main(int argc, const char* argv[]) {
  int c;
  int quiet = 0;
  int ok = 1;

  INIT_WARGV(argc, argv);

  for (c = 1; ok && c < argc; ++c) {
    if (!strcmp(argv[c], "-quiet")) {
      quiet = 1;
    } else if (!strcmp(argv[c], "-help") || !strcmp(argv[c], "-h")) {
      printf("webp_quality [-h][-quiet] webp_files...\n");
      FREE_WARGV_AND_RETURN(0);
    } else {
      const char* const filename = (const char*)GET_WARGV(argv, c);
      const uint8_t* data = NULL;
      size_t data_size = 0;
      int q;
      ok = ImgIoUtilReadFile(filename, &data, &data_size);
      if (!ok) break;
      q = VP8EstimateQuality(data, data_size);
      if (!quiet) WPRINTF("[%s] ", (const W_CHAR*)filename);
      if (q < 0) {
        fprintf(stderr, "Not a WebP file, or not a lossy WebP file.\n");
        ok = 0;
      } else {
        if (!quiet) {
          printf("Estimated quality factor: %d\n", q);
        } else {
          printf("%d\n", q);   // just print the number
        }
      }
      free((void*)data);
    }
  }
  FREE_WARGV_AND_RETURN(ok ? 0 : 1);
}